

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar1;
  int iVar2;
  appender aVar3;
  undefined4 in_register_00000014;
  digit_grouping<char> *in_R9;
  undefined1 in_stack_ffffffffffffff08 [12];
  undefined4 in_stack_ffffffffffffff14;
  anon_class_32_4_dca7119b local_e8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_c8;
  type local_bc;
  undefined1 auStack_b8 [4];
  uint size;
  buffer<char> *local_a8;
  undefined8 local_a0;
  detail local_98 [8];
  char digits [40];
  int local_54;
  digit_grouping<char> *pdStack_50;
  int num_digits;
  digit_grouping<char> *grouping_local;
  basic_format_specs<char> *specs_local;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bStack_38;
  uint prefix_local;
  unsigned___int128 value_local;
  undefined8 local_20;
  appender local_18;
  appender out_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,prefix);
  specs_local._4_4_ = (int)specs;
  n._12_4_ = in_stack_ffffffffffffff14;
  n._0_12_ = in_stack_ffffffffffffff08;
  pdStack_50 = in_R9;
  grouping_local = grouping;
  bStack_38 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  value_local._8_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_20 = (undefined8)value_local;
  local_18.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
  local_54 = count_digits((detail *)
                          out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                          (uint128_opt)n);
  local_a0 = (undefined8)value_local;
  local_a8 = bStack_38.container;
  value_00._12_4_ = in_stack_ffffffffffffff14;
  value_00._0_12_ = in_stack_ffffffffffffff08;
  _auStack_b8 = format_decimal<char,unsigned__int128>
                          (local_98,(char *)bStack_38.container,(unsigned___int128)value_00,
                           (int)(undefined8)value_local);
  iVar1 = (uint)(specs_local._4_4_ != 0) + local_54;
  iVar2 = digit_grouping<char>::count_separators(pdStack_50,local_54);
  local_bc = to_unsigned<int>(iVar1 + iVar2);
  local_c8 = local_18.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_e8.prefix = (uint *)((long)&specs_local + 4);
  local_e8.grouping = pdStack_50;
  local_e8.digits = (char (*) [40])local_98;
  local_e8.num_digits = &local_54;
  aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>(fmt::v9::appender,unsigned__int128,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::digit_grouping<char>const&)::_lambda(fmt::v9::appender)_1_>
                    (local_18,(basic_format_specs<char> *)grouping_local,(ulong)local_bc,
                     (ulong)local_bc,&local_e8);
  return (appender)
         aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) {
          char sign = static_cast<char>(prefix);
          *it++ = static_cast<Char>(sign);
        }
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}